

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O1

void YuvToArgbRow_SSE2(uint8_t *y,uint8_t *u,uint8_t *v,uint8_t *dst,int len)

{
  char cVar1;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [16];
  undefined1 auVar32 [15];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [15];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [14];
  undefined1 auVar43 [12];
  unkbyte10 Var44;
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  uint3 uVar48;
  unkbyte9 Var49;
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  uint5 uVar52;
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [14];
  undefined1 auVar56 [13];
  undefined1 auVar57 [15];
  undefined1 auVar58 [13];
  undefined1 auVar59 [15];
  undefined1 auVar60 [13];
  undefined1 auVar61 [15];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  uint uVar69;
  uint uVar70;
  int iVar71;
  long lVar72;
  uint8_t uVar73;
  uint uVar74;
  uint uVar75;
  undefined1 uVar85;
  undefined1 uVar86;
  undefined1 uVar87;
  byte bVar88;
  byte bVar89;
  byte bVar90;
  byte bVar91;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  ushort uVar92;
  char cVar100;
  ushort uVar101;
  ushort uVar102;
  ushort uVar103;
  ushort uVar104;
  ushort uVar105;
  ushort uVar106;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  ushort uVar107;
  undefined1 auVar96 [16];
  undefined1 auVar108 [16];
  undefined2 uVar109;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar119 [16];
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined4 uVar110;
  undefined6 uVar111;
  undefined8 uVar112;
  undefined1 auVar113 [12];
  undefined1 auVar114 [14];
  undefined1 auVar118 [16];
  
  auVar68 = _DAT_0012ce60;
  auVar67 = _DAT_0012ce50;
  auVar66 = _DAT_0012ce30;
  auVar65 = _DAT_0012ce20;
  auVar64 = _DAT_0012ce00;
  auVar63 = _DAT_0012cdf0;
  auVar62 = _DAT_0012cc10;
  uVar69 = 0;
  if (7 < len) {
    uVar69 = len & 0x7ffffff8;
    iVar71 = 8;
    do {
      uVar112 = *(undefined8 *)y;
      bVar91 = (byte)((ulong)uVar112 >> 0x38);
      bVar90 = (byte)((ulong)uVar112 >> 0x30);
      bVar89 = (byte)((ulong)uVar112 >> 0x28);
      auVar50[10] = 0;
      auVar50._0_10_ = SUB1610((undefined1  [16])0x0,0);
      auVar50[0xb] = bVar89;
      bVar88 = (byte)((ulong)uVar112 >> 0x20);
      auVar51[9] = bVar88;
      auVar51._0_9_ = SUB169((undefined1  [16])0x0,0);
      auVar51._10_2_ = auVar50._10_2_;
      auVar53._9_3_ = auVar51._9_3_;
      auVar53._0_9_ = (unkuint9)0;
      uVar87 = (undefined1)((ulong)uVar112 >> 0x18);
      uVar86 = (undefined1)((ulong)uVar112 >> 0x10);
      auVar31._1_10_ = SUB1610(ZEXT516(CONCAT41(auVar53._8_4_,uVar87)) << 0x38,6);
      auVar31[0] = uVar86;
      auVar31._11_5_ = 0;
      uVar85 = (undefined1)((ulong)uVar112 >> 8);
      auVar119._1_12_ = SUB1612(auVar31 << 0x28,4);
      auVar119[0] = uVar85;
      auVar119._13_3_ = 0;
      auVar77._1_14_ = SUB1614(auVar119 << 0x18,2);
      auVar77[0] = (char)uVar112;
      auVar77[0xf] = 0;
      auVar77 = auVar77 << 8;
      auVar16[0xd] = 0;
      auVar16._0_13_ = auVar77._0_13_;
      auVar16[0xe] = uVar87;
      auVar19[0xc] = 0;
      auVar19._0_12_ = auVar77._0_12_;
      auVar19._13_2_ = auVar16._13_2_;
      auVar22[0xb] = 0;
      auVar22._0_11_ = auVar77._0_11_;
      auVar22._12_3_ = auVar19._12_3_;
      auVar25[10] = uVar86;
      auVar25._0_10_ = auVar77._0_10_;
      auVar25._11_4_ = auVar22._11_4_;
      auVar28[9] = 0;
      auVar28._0_9_ = auVar77._0_9_;
      auVar28._10_5_ = auVar25._10_5_;
      auVar32[8] = 0;
      auVar32._0_8_ = auVar77._0_8_;
      auVar32._9_6_ = auVar28._9_6_;
      auVar39._7_8_ = 0;
      auVar39._0_7_ = auVar32._8_7_;
      auVar45._1_8_ = SUB158(auVar39 << 0x40,7);
      auVar45[0] = uVar85;
      auVar45._9_6_ = 0;
      auVar57._10_5_ = 0;
      auVar57._0_10_ = SUB1510(auVar45 << 0x30,5);
      auVar56._1_12_ = SUB1512(auVar57 << 0x28,3);
      auVar56[0] = (char)uVar112;
      auVar76._4_3_ = auVar19._12_3_;
      auVar76._0_4_ = auVar56._0_4_ << 0x10;
      auVar76[7] = 0;
      auVar76._8_4_ = auVar32._8_4_;
      auVar76._12_4_ = SUB154(auVar45 << 0x30,5) << 8;
      auVar77 = pshufhw(auVar76,auVar76,0xc4);
      auVar78._0_4_ = auVar77._0_4_;
      auVar78._8_4_ = auVar77._8_4_;
      auVar78._4_4_ = auVar77._12_4_;
      auVar78._12_4_ = auVar77._4_4_;
      auVar78 = auVar78 & auVar62;
      sVar6 = auVar78._0_2_;
      sVar7 = auVar78._2_2_;
      auVar79[1] = (0 < sVar7) * (sVar7 < 0x100) * auVar78[2] - (0xff < sVar7);
      auVar79[0] = (0 < sVar6) * (sVar6 < 0x100) * auVar78[0] - (0xff < sVar6);
      sVar6 = auVar78._4_2_;
      auVar79[2] = (0 < sVar6) * (sVar6 < 0x100) * auVar78[4] - (0xff < sVar6);
      sVar6 = auVar78._6_2_;
      auVar79[3] = (0 < sVar6) * (sVar6 < 0x100) * auVar78[6] - (0xff < sVar6);
      sVar6 = auVar78._8_2_;
      auVar79[4] = (0 < sVar6) * (sVar6 < 0x100) * auVar78[8] - (0xff < sVar6);
      sVar6 = auVar78._10_2_;
      auVar79[5] = (0 < sVar6) * (sVar6 < 0x100) * auVar78[10] - (0xff < sVar6);
      sVar6 = auVar78._12_2_;
      auVar79[6] = (0 < sVar6) * (sVar6 < 0x100) * auVar78[0xc] - (0xff < sVar6);
      sVar6 = auVar78._14_2_;
      auVar79[7] = (0 < sVar6) * (sVar6 < 0x100) * auVar78[0xe] - (0xff < sVar6);
      auVar79[8] = 0;
      auVar79[9] = (bVar88 != 0) * (bVar88 < 0x100) * bVar88 - (0xff < bVar88);
      auVar79[10] = 0;
      auVar79[0xb] = (bVar89 != 0) * (bVar89 < 0x100) * bVar89 - (0xff < bVar89);
      auVar79[0xc] = 0;
      auVar79[0xd] = (bVar90 != 0) * (bVar90 < 0x100) * bVar90 - (0xff < bVar90);
      auVar79[0xe] = 0;
      auVar79[0xf] = (bVar91 != 0) * (bVar91 < 0x100) * bVar91 - (0xff < bVar91);
      auVar77 = pmulhuw(auVar79,auVar63);
      uVar110 = *(undefined4 *)u;
      bVar88 = (byte)((uint)uVar110 >> 0x18);
      cVar100 = (char)((uint)uVar110 >> 0x10);
      auVar34._1_10_ = SUB1610(ZEXT116(bVar88) << 0x38,6);
      auVar34[0] = cVar100;
      auVar34._11_5_ = 0;
      uVar85 = (undefined1)((uint)uVar110 >> 8);
      auVar33._1_12_ = SUB1612(auVar34 << 0x28,4);
      auVar33[0] = uVar85;
      auVar33._13_3_ = 0;
      auVar94._1_14_ = SUB1614(auVar33 << 0x18,2);
      auVar94[0] = (char)uVar110;
      auVar94[0xf] = 0;
      auVar94 = auVar94 << 8;
      auVar17[0xd] = 0;
      auVar17._0_13_ = auVar94._0_13_;
      auVar17[0xe] = bVar88;
      auVar20[0xc] = 0;
      auVar20._0_12_ = auVar94._0_12_;
      auVar20._13_2_ = auVar17._13_2_;
      auVar23[0xb] = 0;
      auVar23._0_11_ = auVar94._0_11_;
      auVar23._12_3_ = auVar20._12_3_;
      auVar26[10] = cVar100;
      auVar26._0_10_ = auVar94._0_10_;
      auVar26._11_4_ = auVar23._11_4_;
      auVar29[9] = 0;
      auVar29._0_9_ = auVar94._0_9_;
      auVar29._10_5_ = auVar26._10_5_;
      auVar35[8] = 0;
      auVar35._0_8_ = auVar94._0_8_;
      auVar35._9_6_ = auVar29._9_6_;
      auVar40._7_8_ = 0;
      auVar40._0_7_ = auVar35._8_7_;
      auVar46._1_8_ = SUB158(auVar40 << 0x40,7);
      auVar46[0] = uVar85;
      auVar46._9_6_ = 0;
      auVar59._10_5_ = 0;
      auVar59._0_10_ = SUB1510(auVar46 << 0x30,5);
      auVar58._1_12_ = SUB1512(auVar59 << 0x28,3);
      auVar58[0] = (char)uVar110;
      auVar93._4_4_ = auVar35._8_4_;
      auVar93._0_4_ = auVar58._0_4_ << 0x10;
      auVar93._8_4_ = auVar35._8_4_;
      auVar93._12_4_ = SUB154(auVar46 << 0x30,5) << 8;
      auVar94 = pshuflw(auVar93,auVar93,100);
      auVar94 = pshufhw(auVar94,auVar94,0xcc);
      sVar6 = auVar94._0_2_;
      sVar7 = auVar94._2_2_;
      auVar95[1] = (0 < sVar7) * (sVar7 < 0x100) * auVar94[2] - (0xff < sVar7);
      auVar95[0] = (0 < sVar6) * (sVar6 < 0x100) * auVar94[0] - (0xff < sVar6);
      sVar6 = auVar94._4_2_;
      auVar95[2] = (0 < sVar6) * (sVar6 < 0x100) * auVar94[4] - (0xff < sVar6);
      sVar6 = auVar94._6_2_;
      auVar95[3] = (0 < sVar6) * (sVar6 < 0x100) * auVar94[6] - (0xff < sVar6);
      sVar6 = auVar94._8_2_;
      auVar95[4] = (0 < sVar6) * (sVar6 < 0x100) * auVar94[8] - (0xff < sVar6);
      sVar6 = auVar94._10_2_;
      auVar95[5] = (0 < sVar6) * (sVar6 < 0x100) * auVar94[10] - (0xff < sVar6);
      sVar6 = auVar94._12_2_;
      auVar95[6] = (0 < sVar6) * (sVar6 < 0x100) * auVar94[0xc] - (0xff < sVar6);
      sVar6 = auVar94._14_2_;
      auVar95[7] = (0 < sVar6) * (sVar6 < 0x100) * auVar94[0xe] - (0xff < sVar6);
      auVar95[8] = -(0xff < auVar35._8_2_);
      sVar6 = auVar26._10_2_;
      auVar95[9] = (0 < sVar6) * (sVar6 < 0x100) * cVar100 - (0xff < sVar6);
      auVar95[10] = -(0xff < auVar35._8_2_);
      auVar95[0xb] = (0 < sVar6) * (sVar6 < 0x100) * cVar100 - (0xff < sVar6);
      auVar95[0xc] = -(0xff < auVar20._12_2_);
      uVar92 = (ushort)bVar88;
      auVar95[0xd] = (bVar88 != 0) * (uVar92 < 0x100) * bVar88 - (0xff < uVar92);
      auVar95[0xe] = -(0xff < auVar20._12_2_);
      auVar95[0xf] = (bVar88 != 0) * (uVar92 < 0x100) * bVar88 - (0xff < uVar92);
      uVar110 = *(undefined4 *)v;
      bVar88 = (byte)((uint)uVar110 >> 0x18);
      cVar100 = (char)((uint)uVar110 >> 0x10);
      auVar37._1_10_ = SUB1610(ZEXT116(bVar88) << 0x38,6);
      auVar37[0] = cVar100;
      auVar37._11_5_ = 0;
      uVar85 = (undefined1)((uint)uVar110 >> 8);
      auVar36._1_12_ = SUB1612(auVar37 << 0x28,4);
      auVar36[0] = uVar85;
      auVar36._13_3_ = 0;
      auVar117._1_14_ = SUB1614(auVar36 << 0x18,2);
      auVar117[0] = (char)uVar110;
      auVar117[0xf] = 0;
      auVar117 = auVar117 << 8;
      auVar18[0xd] = 0;
      auVar18._0_13_ = auVar117._0_13_;
      auVar18[0xe] = bVar88;
      auVar21[0xc] = 0;
      auVar21._0_12_ = auVar117._0_12_;
      auVar21._13_2_ = auVar18._13_2_;
      auVar24[0xb] = 0;
      auVar24._0_11_ = auVar117._0_11_;
      auVar24._12_3_ = auVar21._12_3_;
      auVar27[10] = cVar100;
      auVar27._0_10_ = auVar117._0_10_;
      auVar27._11_4_ = auVar24._11_4_;
      auVar30[9] = 0;
      auVar30._0_9_ = auVar117._0_9_;
      auVar30._10_5_ = auVar27._10_5_;
      auVar38[8] = 0;
      auVar38._0_8_ = auVar117._0_8_;
      auVar38._9_6_ = auVar30._9_6_;
      auVar41._7_8_ = 0;
      auVar41._0_7_ = auVar38._8_7_;
      auVar47._1_8_ = SUB158(auVar41 << 0x40,7);
      auVar47[0] = uVar85;
      auVar47._9_6_ = 0;
      auVar61._10_5_ = 0;
      auVar61._0_10_ = SUB1510(auVar47 << 0x30,5);
      auVar60._1_12_ = SUB1512(auVar61 << 0x28,3);
      auVar60[0] = (char)uVar110;
      auVar115._0_4_ = auVar60._0_4_ << 0x10;
      auVar115._8_4_ = auVar38._8_4_;
      auVar115._4_4_ = auVar115._8_4_;
      auVar115._12_4_ = SUB154(auVar47 << 0x30,5) << 8;
      auVar94 = pshuflw(auVar115,auVar115,100);
      auVar94 = pshufhw(auVar94,auVar94,0xcc);
      sVar6 = auVar94._0_2_;
      sVar7 = auVar94._2_2_;
      auVar116[1] = (0 < sVar7) * (sVar7 < 0x100) * auVar94[2] - (0xff < sVar7);
      auVar116[0] = (0 < sVar6) * (sVar6 < 0x100) * auVar94[0] - (0xff < sVar6);
      sVar6 = auVar94._4_2_;
      auVar116[2] = (0 < sVar6) * (sVar6 < 0x100) * auVar94[4] - (0xff < sVar6);
      sVar6 = auVar94._6_2_;
      auVar116[3] = (0 < sVar6) * (sVar6 < 0x100) * auVar94[6] - (0xff < sVar6);
      sVar6 = auVar94._8_2_;
      auVar116[4] = (0 < sVar6) * (sVar6 < 0x100) * auVar94[8] - (0xff < sVar6);
      sVar6 = auVar94._10_2_;
      auVar116[5] = (0 < sVar6) * (sVar6 < 0x100) * auVar94[10] - (0xff < sVar6);
      sVar6 = auVar94._12_2_;
      auVar116[6] = (0 < sVar6) * (sVar6 < 0x100) * auVar94[0xc] - (0xff < sVar6);
      sVar6 = auVar94._14_2_;
      auVar116[7] = (0 < sVar6) * (sVar6 < 0x100) * auVar94[0xe] - (0xff < sVar6);
      auVar116[8] = -(0xff < auVar38._8_2_);
      sVar6 = auVar27._10_2_;
      auVar116[9] = (0 < sVar6) * (sVar6 < 0x100) * cVar100 - (0xff < sVar6);
      auVar116[10] = -(0xff < auVar38._8_2_);
      auVar116[0xb] = (0 < sVar6) * (sVar6 < 0x100) * cVar100 - (0xff < sVar6);
      auVar116[0xc] = -(0xff < auVar21._12_2_);
      uVar92 = (ushort)bVar88;
      auVar116[0xd] = (bVar88 != 0) * (uVar92 < 0x100) * bVar88 - (0xff < uVar92);
      auVar116[0xe] = -(0xff < auVar21._12_2_);
      auVar116[0xf] = (bVar88 != 0) * (uVar92 < 0x100) * bVar88 - (0xff < uVar92);
      auVar94 = pmulhuw(auVar116,auVar64);
      auVar108._0_2_ = auVar94._0_2_ + auVar77._0_2_ + -0x379a;
      auVar108._2_2_ = auVar94._2_2_ + auVar77._2_2_ + -0x379a;
      auVar108._4_2_ = auVar94._4_2_ + auVar77._4_2_ + -0x379a;
      auVar108._6_2_ = auVar94._6_2_ + auVar77._6_2_ + -0x379a;
      auVar108._8_2_ = auVar94._8_2_ + auVar77._8_2_ + -0x379a;
      auVar108._10_2_ = auVar94._10_2_ + auVar77._10_2_ + -0x379a;
      auVar108._12_2_ = auVar94._12_2_ + auVar77._12_2_ + -0x379a;
      auVar108._14_2_ = auVar94._14_2_ + auVar77._14_2_ + -0x379a;
      auVar119 = pmulhuw(auVar95,auVar65);
      auVar117 = pmulhuw(auVar116,auVar66);
      auVar94 = pmulhuw(auVar95,auVar67);
      auVar94 = paddusw(auVar94,auVar77);
      auVar80._0_2_ = (auVar77._0_2_ - (auVar117._0_2_ + auVar119._0_2_)) + 0x2204;
      auVar80._2_2_ = (auVar77._2_2_ - (auVar117._2_2_ + auVar119._2_2_)) + 0x2204;
      auVar80._4_2_ = (auVar77._4_2_ - (auVar117._4_2_ + auVar119._4_2_)) + 0x2204;
      auVar80._6_2_ = (auVar77._6_2_ - (auVar117._6_2_ + auVar119._6_2_)) + 0x2204;
      auVar80._8_2_ = (auVar77._8_2_ - (auVar117._8_2_ + auVar119._8_2_)) + 0x2204;
      auVar80._10_2_ = (auVar77._10_2_ - (auVar117._10_2_ + auVar119._10_2_)) + 0x2204;
      auVar80._12_2_ = (auVar77._12_2_ - (auVar117._12_2_ + auVar119._12_2_)) + 0x2204;
      auVar80._14_2_ = (auVar77._14_2_ - (auVar117._14_2_ + auVar119._14_2_)) + 0x2204;
      auVar94 = psubusw(auVar94,auVar68);
      auVar117 = psraw(auVar108,6);
      auVar77 = psraw(auVar80,6);
      sVar6 = auVar77._0_2_;
      cVar100 = (0 < sVar6) * (sVar6 < 0x100) * auVar77[0] - (0xff < sVar6);
      uVar109 = CONCAT11(cVar100,0xff);
      sVar6 = auVar77._2_2_;
      cVar1 = (0 < sVar6) * (sVar6 < 0x100) * auVar77[2] - (0xff < sVar6);
      uVar48 = CONCAT12(cVar1,uVar109);
      sVar6 = auVar77._4_2_;
      cVar2 = (0 < sVar6) * (sVar6 < 0x100) * auVar77[4] - (0xff < sVar6);
      uVar110 = CONCAT13(cVar2,uVar48);
      sVar6 = auVar77._6_2_;
      cVar3 = (0 < sVar6) * (sVar6 < 0x100) * auVar77[6] - (0xff < sVar6);
      uVar52 = CONCAT14(cVar3,uVar110);
      auVar54._5_7_ = 0;
      auVar54._0_5_ = uVar52;
      sVar6 = auVar77._8_2_;
      cVar4 = (0 < sVar6) * (sVar6 < 0x100) * auVar77[8] - (0xff < sVar6);
      uVar111 = CONCAT15(cVar4,uVar52);
      sVar6 = auVar77._10_2_;
      cVar5 = (0 < sVar6) * (sVar6 < 0x100) * auVar77[10] - (0xff < sVar6);
      auVar55[6] = cVar5;
      auVar55._0_6_ = uVar111;
      auVar55._7_7_ = 0;
      sVar14 = auVar77._12_2_;
      sVar15 = auVar77._14_2_;
      uVar92 = auVar94._0_2_ >> 6;
      uVar101 = auVar94._2_2_ >> 6;
      uVar102 = auVar94._4_2_ >> 6;
      uVar103 = auVar94._6_2_ >> 6;
      uVar104 = auVar94._8_2_ >> 6;
      uVar105 = auVar94._10_2_ >> 6;
      uVar106 = auVar94._12_2_ >> 6;
      uVar107 = auVar94._14_2_ >> 6;
      sVar6 = auVar117._0_2_;
      sVar7 = auVar117._2_2_;
      sVar8 = auVar117._4_2_;
      sVar9 = auVar117._6_2_;
      sVar10 = auVar117._8_2_;
      sVar11 = auVar117._10_2_;
      sVar12 = auVar117._12_2_;
      sVar13 = auVar117._14_2_;
      auVar84[0xe] = 0xff;
      auVar84._0_14_ = auVar55 << 0x38;
      auVar84[0xf] = (0 < sVar13) * (sVar13 < 0x100) * auVar117[0xe] - (0xff < sVar13);
      auVar83._13_3_ =
           (undefined3)
           (CONCAT27(auVar84._14_2_,
                     CONCAT16((0 < sVar12) * (sVar12 < 0x100) * auVar117[0xc] - (0xff < sVar12),
                              uVar111)) >> 0x30);
      auVar83[0xc] = 0xff;
      auVar83._0_12_ = auVar54 << 0x38;
      auVar82._11_5_ =
           (undefined5)
           (CONCAT45(auVar83._12_4_,
                     CONCAT14((0 < sVar11) * (sVar11 < 0x100) * auVar117[10] - (0xff < sVar11),
                              uVar110)) >> 0x20);
      auVar82[10] = 0xff;
      auVar82._0_10_ = (unkuint10)uVar48 << 0x38;
      Var49 = CONCAT72((int7)(CONCAT63(auVar82._10_6_,
                                       CONCAT12((0 < sVar10) * (sVar10 < 0x100) * auVar117[8] -
                                                (0xff < sVar10),uVar109)) >> 0x10),0xffff);
      Var44 = CONCAT91(CONCAT81((long)((unkuint9)Var49 >> 8),
                                (0 < sVar9) * (sVar9 < 0x100) * auVar117[6] - (0xff < sVar9)),0xff);
      auVar43._2_10_ = Var44;
      auVar43[1] = (0 < sVar8) * (sVar8 < 0x100) * auVar117[4] - (0xff < sVar8);
      auVar43[0] = 0xff;
      auVar42._2_12_ = auVar43;
      auVar42[1] = (0 < sVar7) * (sVar7 < 0x100) * auVar117[2] - (0xff < sVar7);
      auVar42[0] = 0xff;
      auVar81._0_2_ = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar117[0] - (0xff < sVar6),0xff);
      auVar81._2_14_ = auVar42;
      uVar109 = CONCAT11((uVar92 != 0) * (uVar92 < 0x100) * (char)uVar92 - (0xff < uVar92),cVar100);
      uVar110 = CONCAT13((uVar101 != 0) * (uVar101 < 0x100) * (char)uVar101 - (0xff < uVar101),
                         CONCAT12(cVar1,uVar109));
      uVar111 = CONCAT15((uVar102 != 0) * (uVar102 < 0x100) * (char)uVar102 - (0xff < uVar102),
                         CONCAT14(cVar2,uVar110));
      uVar112 = CONCAT17((uVar103 != 0) * (uVar103 < 0x100) * (char)uVar103 - (0xff < uVar103),
                         CONCAT16(cVar3,uVar111));
      auVar113._0_10_ =
           CONCAT19((uVar104 != 0) * (uVar104 < 0x100) * (char)uVar104 - (0xff < uVar104),
                    CONCAT18(cVar4,uVar112));
      auVar113[10] = cVar5;
      auVar113[0xb] = (uVar105 != 0) * (uVar105 < 0x100) * (char)uVar105 - (0xff < uVar105);
      auVar114[0xc] = (0 < sVar14) * (sVar14 < 0x100) * auVar77[0xc] - (0xff < sVar14);
      auVar114._0_12_ = auVar113;
      auVar114[0xd] = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 - (0xff < uVar106);
      auVar118[0xe] = (0 < sVar15) * (sVar15 < 0x100) * auVar77[0xe] - (0xff < sVar15);
      auVar118._0_14_ = auVar114;
      auVar118[0xf] = (uVar107 != 0) * (uVar107 < 0x100) * (char)uVar107 - (0xff < uVar107);
      auVar99._0_12_ = auVar81._0_12_;
      auVar99._12_2_ = (short)Var44;
      auVar99._14_2_ = (short)((ulong)uVar112 >> 0x30);
      auVar98._12_4_ = auVar99._12_4_;
      auVar98._0_10_ = auVar81._0_10_;
      auVar98._10_2_ = (short)((uint6)uVar111 >> 0x20);
      auVar97._10_6_ = auVar98._10_6_;
      auVar97._0_8_ = auVar81._0_8_;
      auVar97._8_2_ = auVar43._0_2_;
      auVar96._8_8_ = auVar97._8_8_;
      auVar96._6_2_ = (short)((uint)uVar110 >> 0x10);
      auVar96._4_2_ = auVar42._0_2_;
      auVar96._2_2_ = uVar109;
      auVar96._0_2_ = auVar81._0_2_;
      *(undefined1 (*) [16])dst = auVar96;
      *(short *)*(undefined1 (*) [16])((long)dst + 0x10) = (short)((unkuint9)Var49 >> 8);
      *(short *)(*(undefined1 (*) [16])((long)dst + 0x10) + 2) =
           (short)((unkuint10)auVar113._0_10_ >> 0x40);
      *(short *)(*(undefined1 (*) [16])((long)dst + 0x10) + 4) = auVar82._10_2_;
      *(short *)(*(undefined1 (*) [16])((long)dst + 0x10) + 6) = auVar113._10_2_;
      *(short *)(*(undefined1 (*) [16])((long)dst + 0x10) + 8) = auVar83._12_2_;
      *(short *)(*(undefined1 (*) [16])((long)dst + 0x10) + 10) = auVar114._12_2_;
      *(short *)(*(undefined1 (*) [16])((long)dst + 0x10) + 0xc) = auVar84._14_2_;
      *(short *)(*(undefined1 (*) [16])((long)dst + 0x10) + 0xe) = auVar118._14_2_;
      y = y + 8;
      u = u + 4;
      v = v + 4;
      dst = (uint8_t *)((long)dst + 0x20);
      iVar71 = iVar71 + 8;
    } while (iVar71 <= len);
  }
  if ((int)uVar69 < len) {
    lVar72 = 0;
    do {
      bVar88 = *u;
      bVar89 = *v;
      uVar70 = (uint)y[lVar72] * 0x4a85 >> 8;
      uVar74 = ((uint)bVar89 * 0x6625 >> 8) + uVar70;
      uVar75 = uVar74 - 0x379a;
      uVar73 = (uVar74 < 0x379a) + 0xff;
      if (uVar75 < 0x4000) {
        uVar73 = (uint8_t)(uVar75 >> 6);
      }
      (*(undefined1 (*) [16])dst)[lVar72 * 4] = 0xff;
      (*(undefined1 (*) [16])dst)[lVar72 * 4 + 1] = uVar73;
      iVar71 = ((uint)bVar89 * 0x3408 >> 8) + ((uint)bVar88 * 0x1913 >> 8);
      uVar74 = (uVar70 - iVar71) + 0x2204;
      uVar73 = -(-0x2205 < (int)(uVar70 - iVar71));
      if (uVar74 < 0x4000) {
        uVar73 = (uint8_t)(uVar74 >> 6);
      }
      (*(undefined1 (*) [16])dst)[lVar72 * 4 + 2] = uVar73;
      uVar70 = ((uint)bVar88 * 0x811a >> 8) + uVar70;
      uVar74 = uVar70 - 0x4515;
      uVar73 = (uVar70 < 0x4515) + 0xff;
      if (uVar74 < 0x4000) {
        uVar73 = (uint8_t)(uVar74 >> 6);
      }
      (*(undefined1 (*) [16])dst)[lVar72 * 4 + 3] = uVar73;
      uVar70 = uVar69 + (int)lVar72 & 1;
      u = u + uVar70;
      v = v + uVar70;
      lVar72 = lVar72 + 1;
    } while (len - uVar69 != (int)lVar72);
  }
  return;
}

Assistant:

static void YuvToArgbRow_SSE2(const uint8_t* y,
                              const uint8_t* u, const uint8_t* v,
                              uint8_t* dst, int len) {
  const __m128i kAlpha = _mm_set1_epi16(255);
  int n;
  for (n = 0; n + 8 <= len; n += 8, dst += 32) {
    __m128i R, G, B;
    YUV420ToRGB_SSE2(y, u, v, &R, &G, &B);
    PackAndStore4_SSE2(&kAlpha, &R, &G, &B, dst);
    y += 8;
    u += 4;
    v += 4;
  }
  for (; n < len; ++n) {   // Finish off
    VP8YuvToArgb(y[0], u[0], v[0], dst);
    dst += 4;
    y += 1;
    u += (n & 1);
    v += (n & 1);
  }
}